

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O1

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btVector3 *pivotInA,
          btVector3 *pivotInB,btVector3 *axisInA,btVector3 *axisInB,bool useReferenceFrameA)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  btScalar bVar5;
  float fVar6;
  btScalar bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  btScalar bVar15;
  btScalar bVar16;
  btScalar bVar17;
  btScalar bVar18;
  float fVar19;
  float fVar20;
  
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,HINGE_CONSTRAINT_TYPE,rbA,rbB)
  ;
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_002282b0;
  (this->m_limit).m_center = 0.0;
  (this->m_limit).m_halfRange = -1.0;
  (this->m_limit).m_softness = 0.9;
  (this->m_limit).m_biasFactor = 0.3;
  (this->m_limit).m_relaxationFactor = 1.0;
  (this->m_limit).m_correction = 0.0;
  (this->m_limit).m_sign = 0.0;
  (this->m_limit).m_solveLimit = false;
  this->m_angularOnly = false;
  this->m_enableAngularMotor = false;
  this->m_useSolveConstraintObsolete = false;
  this->m_useOffsetForConstraintFrame = true;
  this->m_useReferenceFrameA = useReferenceFrameA;
  this->m_flags = 0;
  this->m_normalCFM = 0.0;
  this->m_normalERP = 0.0;
  this->m_stopCFM = 0.0;
  this->m_stopERP = 0.0;
  uVar2 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_origin.m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_origin.m_floats + 2) = uVar2;
  fVar13 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
  fVar1 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
  fVar3 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
  fVar6 = (float)*(undefined8 *)axisInA->m_floats;
  fVar4 = (float)((ulong)*(undefined8 *)axisInA->m_floats >> 0x20);
  fVar12 = axisInA->m_floats[2];
  fVar14 = fVar12 * fVar3 + fVar6 * fVar13 + fVar1 * fVar4;
  if (0.9999999 <= fVar14) {
    bVar17 = -(rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    bVar18 = -(rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    bVar16 = -(rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    bVar5 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    bVar15 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
  }
  else {
    if (-0.9999999 < fVar14) {
      bVar15 = fVar4 * fVar3 - fVar1 * fVar12;
      bVar5 = fVar13 * fVar12 - fVar3 * fVar6;
      bVar7 = fVar1 * fVar6 - fVar13 * fVar4;
      bVar17 = fVar12 * bVar5 - fVar4 * bVar7;
      bVar18 = fVar6 * bVar7 - fVar12 * bVar15;
      bVar16 = bVar15 * fVar4 - bVar5 * fVar6;
      goto LAB_0019aa02;
    }
    bVar15 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    bVar17 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    bVar18 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    bVar16 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    bVar5 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
  }
  bVar7 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
LAB_0019aa02:
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[0] = bVar17;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[1] = bVar15;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[2] = axisInA->m_floats[0];
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[0] = bVar18;
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[1] = bVar5;
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[2] = axisInA->m_floats[1];
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[0] = bVar16;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[1] = bVar7;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[2] = axisInA->m_floats[2];
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  fVar12 = (float)*(undefined8 *)(axisInA->m_floats + 1);
  fVar6 = (float)((ulong)*(undefined8 *)(axisInA->m_floats + 1) >> 0x20);
  fVar4 = (float)*(undefined8 *)(axisInB->m_floats + 1);
  fVar14 = (float)((ulong)*(undefined8 *)(axisInB->m_floats + 1) >> 0x20);
  fVar13 = axisInB->m_floats[0];
  fVar1 = axisInA->m_floats[0];
  fVar3 = fVar14 * fVar6 + fVar1 * fVar13 + fVar12 * fVar4;
  if (-0.9999999 <= fVar3) {
    fVar3 = fVar3 + 1.0;
    fVar3 = fVar3 + fVar3;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar8 = 1.0 / fVar3;
    fVar20 = fVar8 * (fVar12 * fVar14 + -fVar6 * fVar4);
    fVar6 = fVar8 * (fVar6 * fVar13 + -fVar1 * fVar14);
    fVar8 = fVar8 * (fVar1 * fVar4 - fVar13 * fVar12);
    fVar3 = fVar3 * 0.5;
  }
  else {
    if (ABS(fVar6) <= 0.70710677) {
      fVar13 = fVar1 * fVar1 + fVar12 * fVar12;
      if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
      }
      else {
        fVar13 = SQRT(fVar13);
      }
      fVar8 = 0.0;
      fVar20 = -axisInA->m_floats[1] * (1.0 / fVar13);
      fVar6 = (1.0 / fVar13) * axisInA->m_floats[0];
    }
    else {
      fVar13 = fVar12 * fVar12 + fVar6 * fVar6;
      if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
      }
      else {
        fVar13 = SQRT(fVar13);
      }
      fVar20 = 0.0;
      fVar6 = -axisInA->m_floats[2] * (1.0 / fVar13);
      fVar8 = (1.0 / fVar13) * axisInA->m_floats[1];
    }
    fVar3 = 0.0;
  }
  fVar4 = (fVar3 * bVar18 + bVar17 * fVar8) - fVar20 * bVar16;
  fVar10 = (fVar3 * bVar16 + bVar18 * fVar20) - fVar6 * bVar17;
  fVar19 = (-fVar20 * bVar17 - bVar18 * fVar6) - bVar16 * fVar8;
  fVar13 = axisInB->m_floats[0];
  fVar1 = axisInB->m_floats[1];
  fVar12 = axisInB->m_floats[2];
  uVar2 = *(undefined8 *)(pivotInB->m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_origin.m_floats = *(undefined8 *)pivotInB->m_floats;
  *(undefined8 *)((this->m_rbBFrame).m_origin.m_floats + 2) = uVar2;
  fVar9 = (fVar3 * bVar17 + bVar16 * fVar6) - bVar18 * fVar8;
  fVar11 = fVar10 * fVar6 + ((fVar3 * fVar9 - fVar19 * fVar20) - fVar4 * fVar8);
  fVar14 = fVar4 * fVar20 + ((fVar3 * fVar10 - fVar19 * fVar8) - fVar6 * fVar9);
  fVar3 = fVar8 * fVar9 + ((fVar3 * fVar4 - fVar19 * fVar6) - fVar10 * fVar20);
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[0] = fVar11;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[1] = fVar1 * fVar14 - fVar12 * fVar3;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[2] = axisInB->m_floats[0];
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->m_rbBFrame).m_basis.m_el[1].m_floats =
       CONCAT44(fVar12 * fVar11 + -fVar13 * fVar14,fVar3);
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[2] = axisInB->m_floats[1];
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[0] = fVar14;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[1] = fVar13 * fVar3 - fVar11 * fVar1;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[2] = axisInB->m_floats[2];
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  if (this->m_useReferenceFrameA == false) {
    bVar15 = 1.0;
  }
  else {
    bVar15 = -1.0;
  }
  this->m_referenceSign = bVar15;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA,btRigidBody& rbB, const btVector3& pivotInA,const btVector3& pivotInB,
									 const btVector3& axisInA,const btVector3& axisInB, bool useReferenceFrameA)
									 :btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA,rbB),
#ifdef _BT_USE_CENTER_LIMIT_
									 m_limit(),
#endif
									 m_angularOnly(false),
									 m_enableAngularMotor(false),
									 m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
									 m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
									 m_useReferenceFrameA(useReferenceFrameA),
									 m_flags(0),
									 m_normalCFM(0),
									 m_normalERP(0),
									 m_stopCFM(0),
									 m_stopERP(0)
{
	m_rbAFrame.getOrigin() = pivotInA;
	
	// since no frame is given, assume this to be zero angle and just pick rb transform axis
	btVector3 rbAxisA1 = rbA.getCenterOfMassTransform().getBasis().getColumn(0);

	btVector3 rbAxisA2;
	btScalar projection = axisInA.dot(rbAxisA1);
	if (projection >= 1.0f - SIMD_EPSILON) {
		rbAxisA1 = -rbA.getCenterOfMassTransform().getBasis().getColumn(2);
		rbAxisA2 = rbA.getCenterOfMassTransform().getBasis().getColumn(1);
	} else if (projection <= -1.0f + SIMD_EPSILON) {
		rbAxisA1 = rbA.getCenterOfMassTransform().getBasis().getColumn(2);
		rbAxisA2 = rbA.getCenterOfMassTransform().getBasis().getColumn(1);      
	} else {
		rbAxisA2 = axisInA.cross(rbAxisA1);
		rbAxisA1 = rbAxisA2.cross(axisInA);
	}

	m_rbAFrame.getBasis().setValue( rbAxisA1.getX(),rbAxisA2.getX(),axisInA.getX(),
									rbAxisA1.getY(),rbAxisA2.getY(),axisInA.getY(),
									rbAxisA1.getZ(),rbAxisA2.getZ(),axisInA.getZ() );

	btQuaternion rotationArc = shortestArcQuat(axisInA,axisInB);
	btVector3 rbAxisB1 =  quatRotate(rotationArc,rbAxisA1);
	btVector3 rbAxisB2 =  axisInB.cross(rbAxisB1);	
	
	m_rbBFrame.getOrigin() = pivotInB;
	m_rbBFrame.getBasis().setValue( rbAxisB1.getX(),rbAxisB2.getX(),axisInB.getX(),
									rbAxisB1.getY(),rbAxisB2.getY(),axisInB.getY(),
									rbAxisB1.getZ(),rbAxisB2.getZ(),axisInB.getZ() );
	
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}